

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

HighsStatus __thiscall
HighsSparseMatrix::assessStart(HighsSparseMatrix *this,HighsLogOptions *log_options)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  HighsStatus HVar5;
  long lVar6;
  char *format;
  bool bVar7;
  
  puVar4 = (uint *)(this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if (*puVar4 == 0) {
    uVar1 = (&this->num_col_)[this->format_ != kColwise];
    bVar7 = 1 < (int)uVar1;
    if (1 < (int)uVar1) {
      lVar6 = 0;
      do {
        uVar2 = puVar4[lVar6];
        uVar3 = puVar4[lVar6 + 1];
        if ((int)uVar3 < (int)uVar2) {
          format = "Matrix start[%d] = %d > %d = start[%d]\n";
LAB_00381b80:
          highsLogUser(log_options,kError,format,(ulong)((int)lVar6 + 1),(ulong)uVar3,(ulong)uVar2);
          break;
        }
        if ((int)puVar4[(&this->num_col_)[this->format_ != kColwise]] < (int)uVar3) {
          format = "Matrix start[%d] = %d > %d = number of nonzeros\n";
          uVar2 = puVar4[(&this->num_col_)[this->format_ != kColwise]];
          goto LAB_00381b80;
        }
        bVar7 = lVar6 + 2U < (ulong)uVar1;
        lVar6 = lVar6 + 1;
      } while ((ulong)uVar1 - 1 != lVar6);
    }
    HVar5 = -(uint)bVar7;
  }
  else {
    highsLogUser(log_options,kError,"Matrix start[0] = %d, not 0\n",(ulong)*puVar4,0);
    HVar5 = kError;
  }
  return HVar5;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}